

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall
Logger::StructuredFileOutputSink::StructuredFileOutputSink
          (StructuredFileOutputSink *this,uint logMask,FastString *fileName,bool appendToFile,
          int breakSize)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  long lVar4;
  char *local_98;
  uint local_5c;
  undefined2 local_58;
  undefined2 local_56;
  int flags;
  flock fl;
  int breakSize_local;
  bool appendToFile_local;
  FastString *fileName_local;
  uint logMask_local;
  StructuredFileOutputSink *this_local;
  
  OutputSink::OutputSink(&this->super_OutputSink,logMask);
  (this->super_OutputSink)._vptr_OutputSink = (_func_int **)&PTR_checkFlags_0013cbb0;
  Threading::FastLock::FastLock(&this->lock,(char *)0x0,false);
  Bstrlib::String::String(&this->baseFileName,fileName);
  this->breakSize = breakSize;
  this->currentSize = 0;
  this->flipFlop = false;
  this->lastMessageCount = 0;
  Bstrlib::String::String(&this->lastMessage);
  this->lastTime = 0;
  this->lastFlags = 0;
  pcVar2 = Bstrlib::String::operator_cast_to_char_(fileName);
  if (appendToFile) {
    local_98 = "ab";
  }
  else {
    local_98 = "wb";
  }
  pFVar3 = fopen(pcVar2,local_98);
  this->file = (FILE *)pFVar3;
  pFVar3 = _stderr;
  if (this->file == (FILE *)0x0) {
    pcVar2 = Bstrlib::String::operator_cast_to_char_(fileName);
    fprintf(pFVar3,"Logger can not open file \'%s\'\n",pcVar2);
  }
  else {
    local_56 = 0;
    fl.l_type = 0;
    fl.l_whence = 0;
    fl._4_4_ = 0;
    fl.l_start = 0;
    local_58 = 1;
    iVar1 = fileno((FILE *)this->file);
    fcntl(iVar1,6,&local_58);
    iVar1 = fileno((FILE *)this->file);
    local_5c = fcntl(iVar1,1);
    local_5c = local_5c | 1;
    iVar1 = fileno((FILE *)this->file);
    fcntl(iVar1,2,(ulong)local_5c);
    iVar1 = fileno((FILE *)this->file);
    fcntl(iVar1,1);
    fseek((FILE *)this->file,0,2);
    lVar4 = ftell((FILE *)this->file);
    this->currentSize = (int)lVar4;
    if (breakSize < this->currentSize) {
      iVar1 = fileno((FILE *)this->file);
      ftruncate(iVar1,0);
      this->currentSize = 0;
    }
  }
  return;
}

Assistant:

StructuredFileOutputSink::StructuredFileOutputSink(unsigned int logMask, const Strings::FastString & fileName, const bool appendToFile, const int breakSize)
        : OutputSink(logMask), baseFileName(fileName), breakSize(breakSize), currentSize(0), flipFlop(false), lastMessageCount(0), lastTime(0), lastFlags(0),
#ifdef _WIN32
        file(_fsopen(fileName, appendToFile ? "ab" : "wb", _SH_DENYWR))
#elif defined(_POSIX)
        file(fopen(fileName, appendToFile ? "ab" : "wb"))
#endif
	{
        if (file)
        {
#if defined(_POSIX)
            struct flock fl;
            fl.l_whence = SEEK_SET;
            fl.l_start = 0;
            fl.l_len = 0;
            fl.l_type = F_WRLCK;
            fcntl(fileno(file), F_SETLK, &fl);

            // Prevent any child process from inheriting the file on forking
            int flags = fcntl(fileno(file), F_GETFD);
            flags |= FD_CLOEXEC;
            fcntl(fileno(file), F_SETFD, flags);
            flags = fcntl(fileno(file), F_GETFD);
#endif
            // Find out the file size (and leave the pointer at end of file)
            fseek(file, 0, SEEK_END);
            currentSize = (int)ftell(file);
            if (currentSize > breakSize)
            {
                // Truncate the file
#ifdef _WIN32
                _chsize_s(_fileno(file), 0);
                currentSize = 0;
#elif defined(_POSIX)
                ftruncate(fileno(file), 0);
                currentSize = 0;
#endif
            }
        } else fprintf(stderr, "Logger can not open file '%s'\n", (const char*)fileName);
    }